

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O2

int __thiscall rw::PluginList::streamGetSize(PluginList *this,void *object)

{
  LLLink *pLVar1;
  int iVar2;
  LLLink *pLVar3;
  int iVar4;
  
  iVar4 = 0;
  pLVar1 = (this->plugins).link.next;
  while (pLVar3 = pLVar1, pLVar3 != &(this->plugins).link) {
    pLVar1 = pLVar3->next;
    if (pLVar3[-2].next != (LLLink *)0x0) {
      iVar2 = (*(code *)pLVar3[-2].next)
                        (object,*(undefined4 *)&pLVar3[-6].prev,
                         *(undefined4 *)((long)&pLVar3[-6].prev + 4));
      if (0 < iVar2) {
        iVar4 = iVar4 + iVar2 + 0xc;
      }
    }
  }
  return iVar4;
}

Assistant:

int
PluginList::streamGetSize(void *object)
{
	int32 size = 0;
	int32 plgsize;
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->getSize &&
		   (plgsize = p->getSize(object, p->offset, p->size)) > 0)
			size += 12 + plgsize;
	}
	return size;
}